

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_add_goaway
              (nghttp2_session *session,int32_t last_stream_id,uint32_t error_code,
              uint8_t *opaque_data,size_t opaque_data_len,uint8_t aux_flags)

{
  int iVar1;
  int32_t iVar2;
  nghttp2_goaway *pnVar3;
  nghttp2_outbound_item *in_RCX;
  undefined4 in_EDX;
  int32_t in_ESI;
  nghttp2_session *in_RDI;
  size_t in_R8;
  undefined1 in_R9B;
  nghttp2_mem *mem;
  nghttp2_goaway_aux_data *aux_data;
  uint8_t *opaque_data_copy;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  int rv;
  nghttp2_mem *mem_00;
  nghttp2_mem *in_stack_ffffffffffffffb0;
  void *__dest;
  nghttp2_goaway *frame_00;
  int local_4;
  
  __dest = (void *)0x0;
  mem_00 = &in_RDI->mem;
  iVar1 = nghttp2_session_is_my_stream_id(in_RDI,in_ESI);
  if (iVar1 != 0) {
    return -0x1f5;
  }
  if (in_R8 != 0) {
    if (0x4000 < in_R8 + 8) {
      return -0x1f5;
    }
    __dest = nghttp2_mem_malloc(in_stack_ffffffffffffffb0,(size_t)mem_00);
    if (__dest == (void *)0x0) {
      return -0x385;
    }
    memcpy(__dest,in_RCX,in_R8);
  }
  pnVar3 = (nghttp2_goaway *)nghttp2_mem_malloc(in_stack_ffffffffffffffb0,(size_t)mem_00);
  if (pnVar3 == (nghttp2_goaway *)0x0) {
    nghttp2_mem_free(in_stack_ffffffffffffffb0,mem_00);
    local_4 = -0x385;
  }
  else {
    nghttp2_outbound_item_init((nghttp2_outbound_item *)0x119cdc);
    frame_00 = pnVar3;
    iVar2 = nghttp2_min_int32(in_ESI,in_RDI->local_last_stream_id);
    nghttp2_frame_goaway_init
              (frame_00,(int32_t)((ulong)__dest >> 0x20),(uint32_t)__dest,
               (uint8_t *)in_stack_ffffffffffffffb0,(size_t)mem_00);
    pnVar3 = pnVar3 + 2;
    *(undefined1 *)&(pnVar3->hd).length = in_R9B;
    local_4 = nghttp2_session_add_item((nghttp2_session *)CONCAT44(iVar2,in_EDX),in_RCX);
    if (local_4 == 0) {
      in_RDI->goaway_flags = in_RDI->goaway_flags | 0x10;
      local_4 = 0;
    }
    else {
      nghttp2_frame_goaway_free(pnVar3,mem_00);
      nghttp2_mem_free((nghttp2_mem *)pnVar3,mem_00);
    }
  }
  return local_4;
}

Assistant:

int nghttp2_session_add_goaway(nghttp2_session *session, int32_t last_stream_id,
                               uint32_t error_code, const uint8_t *opaque_data,
                               size_t opaque_data_len, uint8_t aux_flags) {
  int rv;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  uint8_t *opaque_data_copy = NULL;
  nghttp2_goaway_aux_data *aux_data;
  nghttp2_mem *mem;

  mem = &session->mem;

  if (nghttp2_session_is_my_stream_id(session, last_stream_id)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (opaque_data_len) {
    if (opaque_data_len + 8 > NGHTTP2_MAX_PAYLOADLEN) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }
    opaque_data_copy = nghttp2_mem_malloc(mem, opaque_data_len);
    if (opaque_data_copy == NULL) {
      return NGHTTP2_ERR_NOMEM;
    }
    memcpy(opaque_data_copy, opaque_data, opaque_data_len);
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    nghttp2_mem_free(mem, opaque_data_copy);
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  /* last_stream_id must not be increased from the value previously
     sent */
  last_stream_id =
    nghttp2_min_int32(last_stream_id, session->local_last_stream_id);

  nghttp2_frame_goaway_init(&frame->goaway, last_stream_id, error_code,
                            opaque_data_copy, opaque_data_len);

  aux_data = &item->aux_data.goaway;
  aux_data->flags = aux_flags;

  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    nghttp2_frame_goaway_free(&frame->goaway, mem);
    nghttp2_mem_free(mem, item);
    return rv;
  }

  session->goaway_flags |= NGHTTP2_GOAWAY_SUBMITTED;

  return 0;
}